

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_ktabk(LexState *ls,TValue *o)

{
  char *str;
  uint32_t uVar1;
  GCstr *pGVar2;
  char *p;
  MSize len;
  MSize tp;
  TValue *o_local;
  LexState *ls_local;
  uint32_t v_3;
  uint32_t v_2;
  uint32_t v_1;
  uint32_t v;
  uint8_t *p_1;
  
  uVar1 = lj_buf_ruleb128(&ls->p);
  if (uVar1 < 5) {
    if (uVar1 == 3) {
      uVar1 = lj_buf_ruleb128(&ls->p);
      o->n = (double)(int)uVar1;
    }
    else if (uVar1 == 4) {
      uVar1 = lj_buf_ruleb128(&ls->p);
      (o->u32).lo = uVar1;
      uVar1 = lj_buf_ruleb128(&ls->p);
      (o->field_4).it = uVar1;
    }
    else {
      o->u64 = (ulong)uVar1 << 0x2f ^ 0xffffffffffffffff;
    }
  }
  else {
    str = ls->p;
    ls->p = ls->p + (uVar1 - 5);
    pGVar2 = lj_str_new(ls->L,str,(ulong)(uVar1 - 5));
    o->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  }
  return;
}

Assistant:

static void bcread_ktabk(LexState *ls, TValue *o)
{
  MSize tp = bcread_uleb128(ls);
  if (tp >= BCDUMP_KTAB_STR) {
    MSize len = tp - BCDUMP_KTAB_STR;
    const char *p = (const char *)bcread_mem(ls, len);
    setstrV(ls->L, o, lj_str_new(ls->L, p, len));
  } else if (tp == BCDUMP_KTAB_INT) {
    setintV(o, (int32_t)bcread_uleb128(ls));
  } else if (tp == BCDUMP_KTAB_NUM) {
    o->u32.lo = bcread_uleb128(ls);
    o->u32.hi = bcread_uleb128(ls);
  } else {
    lj_assertLS(tp <= BCDUMP_KTAB_TRUE, "bad constant type %d", tp);
    setpriV(o, ~tp);
  }
}